

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

Address * __thiscall
cfd::ConfidentialTransactionContext::GetTxOutPegoutAddress
          (ConfidentialTransactionContext *this,uint32_t index,NetType mainchain_network)

{
  size_type sVar1;
  string *message;
  const_reference this_00;
  NetType_conflict in_ECX;
  uint in_EDX;
  long in_RSI;
  Address *in_RDI;
  undefined4 in_stack_ffffffffffffff40;
  allocator *paVar2;
  Address *__return_storage_ptr__;
  Script local_88;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  NetType_conflict local_18;
  uint local_14;
  
  __return_storage_ptr__ = in_RDI;
  local_18 = in_ECX;
  local_14 = in_EDX;
  sVar1 = std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
          size((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                *)(in_RSI + 0x28));
  if (sVar1 <= local_14) {
    local_4d = 1;
    message = (string *)__cxa_allocate_exception(0x30);
    paVar2 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"vout out_of_range error.",paVar2);
    core::CfdException::CfdException
              ((CfdException *)__return_storage_ptr__,(CfdError)((ulong)paVar2 >> 0x20),message);
    local_4d = 0;
    __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  this_00 = std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            ::operator[]((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                          *)(in_RSI + 0x28),(ulong)local_14);
  core::AbstractTxOut::GetLockingScript(&local_88,&this_00->super_AbstractTxOut);
  core::Address::GetPegoutAddress(__return_storage_ptr__,local_18,&local_88);
  core::Script::~Script((Script *)CONCAT44(local_18,in_stack_ffffffffffffff40));
  return in_RDI;
}

Assistant:

Address ConfidentialTransactionContext::GetTxOutPegoutAddress(
    uint32_t index, NetType mainchain_network) const {
  if (vout_.size() <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "vout out_of_range error.");
  }
  return Address::GetPegoutAddress(
      mainchain_network, vout_[index].GetLockingScript());
}